

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

QString * __thiscall
QXmlStreamReader::errorString(QString *__return_storage_ptr__,QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> _Var1;
  Data *pDVar2;
  
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->type == Invalid) {
    pDVar2 = ((_Var1._M_head_impl)->errorString).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = *(char16_t **)((long)&(_Var1._M_head_impl)->errorString + 8);
    (__return_storage_ptr__->d).size =
         *(qsizetype *)((long)&(_Var1._M_head_impl)->errorString + 0x10);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QXmlStreamReader::errorString() const
{
    Q_D(const QXmlStreamReader);
    if (d->type == QXmlStreamReader::Invalid)
        return d->errorString;
    return QString();
}